

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_tools.hpp
# Opt level: O0

uint64_t poplar::bit_tools::popcnt(uint32_t x)

{
  uint32_t x_local;
  
  return (long)POPCOUNT(x);
}

Assistant:

inline uint64_t popcnt(uint32_t x) {
#ifdef __SSE4_2__
    return static_cast<uint64_t>(__builtin_popcount(x));
#else
    x = (x & 0x55555555U) + ((x & 0xAAAAAAAAU) >> 1);
    x = (x & 0x33333333U) + ((x & 0xCCCCCCCCU) >> 2);
    x = (x & 0x0F0F0F0FU) + ((x & 0xF0F0F0F0U) >> 4);
    x *= 0x01010101U;
    return x >> 24;
#endif
}